

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_ge *in_stack_00000020;
  char *in_stack_ffffffffffffffd8;
  uint local_4;
  
  secp256k1_ge_from_bytes(in_stack_00000020,(uchar *)ctx);
  iVar1 = secp256k1_fe_impl_is_zero(in_RSI);
  if (iVar1 != 0) {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    secp256k1_ge_from_bytes(ge, pubkey->data);
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}